

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O3

void __thiscall
Js::DynamicTypeHandler::DynamicTypeHandler
          (DynamicTypeHandler *this,int slotCapacity,uint16 inlineSlotCapacity,
          uint16 offsetOfInlineSlots,BYTE flags)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  PropertyIndex inlineSlotCapacity_00;
  
  this->_vptr_DynamicTypeHandler = (_func_int **)&PTR___cxa_pure_virtual_01541738;
  this->propertyTypes = '\x11';
  this->flags = flags;
  this->offsetOfInlineSlots = offsetOfInlineSlots;
  this->unusedBytes = 1;
  this->protoCachesWereInvalidated = false;
  if ((flags & 4) == 0 && (flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x46,"(!GetIsOrMayBecomeShared() || GetIsLocked())",
                                "!GetIsOrMayBecomeShared() || GetIsLocked()");
    if (!bVar3) goto LAB_00e4ba5d;
    *puVar5 = 0;
  }
  if (inlineSlotCapacity == 0 || offsetOfInlineSlots != 0) {
    if (offsetOfInlineSlots == 0x10 && inlineSlotCapacity == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x48,
                                  "(!IsObjectHeaderInlined(offsetOfInlineSlots) || inlineSlotCapacity != 0)"
                                  ,
                                  "!IsObjectHeaderInlined(offsetOfInlineSlots) || inlineSlotCapacity != 0"
                                 );
      if (!bVar3) goto LAB_00e4ba5d;
      *puVar5 = 0;
    }
    else if (offsetOfInlineSlots != 0x10) goto LAB_00e4b9bc;
    inlineSlotCapacity_00 = 2;
    if (2 < inlineSlotCapacity) {
      inlineSlotCapacity_00 = (inlineSlotCapacity - 1 & 0xfffe) + 2;
    }
    bVar3 = true;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x47,"(offsetOfInlineSlots != 0 || inlineSlotCapacity == 0)",
                                "offsetOfInlineSlots != 0 || inlineSlotCapacity == 0");
    if (!bVar3) goto LAB_00e4ba5d;
    *puVar5 = 0;
LAB_00e4b9bc:
    inlineSlotCapacity_00 = inlineSlotCapacity + 1 & 0xfffe;
    bVar3 = false;
  }
  this->inlineSlotCapacity = inlineSlotCapacity_00;
  iVar4 = RoundUpSlotCapacity(slotCapacity,inlineSlotCapacity_00);
  this->slotCapacity = iVar4;
  TVar1 = this->offsetOfInlineSlots;
  if (TVar1 == 0x10) {
    VerifyObjectHeaderInlinedTypeHandler(this);
  }
  if (bVar3 != (TVar1 == 0x10)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x51,
                                "(IsObjectHeaderInlinedTypeHandler() == IsObjectHeaderInlined(offsetOfInlineSlots))"
                                ,
                                "IsObjectHeaderInlinedTypeHandler() == IsObjectHeaderInlined(offsetOfInlineSlots)"
                               );
    if (!bVar3) {
LAB_00e4ba5d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

DynamicTypeHandler::DynamicTypeHandler(int slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, BYTE flags) :
        flags(flags),
        propertyTypes(PropertyTypesWritableDataOnly | PropertyTypesReserved),
        offsetOfInlineSlots(offsetOfInlineSlots),
        unusedBytes(Js::AtomTag),
        protoCachesWereInvalidated(false)
    {
        Assert(!GetIsOrMayBecomeShared() || GetIsLocked());
        Assert(offsetOfInlineSlots != 0 || inlineSlotCapacity == 0);
        Assert(!IsObjectHeaderInlined(offsetOfInlineSlots) || inlineSlotCapacity != 0);

        // Align the slot capacities and set the total slot capacity
        this->inlineSlotCapacity = inlineSlotCapacity =
            IsObjectHeaderInlined(offsetOfInlineSlots)
                ? RoundUpObjectHeaderInlinedInlineSlotCapacity(inlineSlotCapacity)
                : RoundUpInlineSlotCapacity(inlineSlotCapacity);
        this->slotCapacity = RoundUpSlotCapacity(slotCapacity, inlineSlotCapacity);

        Assert(IsObjectHeaderInlinedTypeHandler() == IsObjectHeaderInlined(offsetOfInlineSlots));
    }